

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O2

int __thiscall protozero::pbf_reader::get_svarint<int>(pbf_reader *this)

{
  uint64_t uVar1;
  assert_error *this_00;
  
  if ((this->m_wire_type & ~length_delimited) == varint) {
    uVar1 = decode_varint(&this->m_data,this->m_end);
    return -((uint)uVar1 & 1) ^ (uint)(uVar1 >> 1);
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error
            (this_00,
             "(has_wire_type(pbf_wire_type::varint) || has_wire_type(pbf_wire_type::length_delimited)) && \"not a varint\""
            );
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T get_svarint() {
        protozero_assert((has_wire_type(pbf_wire_type::varint) || has_wire_type(pbf_wire_type::length_delimited)) && "not a varint");
        return static_cast<T>(decode_zigzag64(decode_varint(&m_data, m_end)));
    }